

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O0

void LibGens::Ym2612Private::KEY_ON(channel_t *CH,int nsl)

{
  slot_t *SL;
  int nsl_local;
  channel_t *CH_local;
  
  if (CH->_SLOT[nsl].Ecurp == 3) {
    CH->_SLOT[nsl].Fcnt = 0;
    CH->_SLOT[nsl].Ecnt =
         *(uint *)(DECAY_TO_ATTACK +
                  (ulong)*(uint *)(ENV_TAB + (long)(CH->_SLOT[nsl].Ecnt >> 0x10) * 4) * 4) &
         CH->_SLOT[nsl].ChgEnM;
    CH->_SLOT[nsl].ChgEnM = -1;
    CH->_SLOT[nsl].Einc = CH->_SLOT[nsl].EincA;
    CH->_SLOT[nsl].Ecmp = 0x10000000;
    CH->_SLOT[nsl].Ecurp = 0;
  }
  return;
}

Assistant:

void Ym2612Private::KEY_ON(channel_t *CH, int nsl)
{
	slot_t *SL = &(CH->_SLOT[nsl]);	// on recupère le bon pointeur de slot

	// la touche est-elle relâchée ?
	if (SL->Ecurp == RELEASE) {
		SL->Fcnt = 0;

		// Fix Ecco 2 splash sound
		SL->Ecnt = (DECAY_TO_ATTACK[ENV_TAB[SL->Ecnt >> ENV_LBITS]] + ENV_ATTACK) & SL->ChgEnM;
		SL->ChgEnM = ~0;

		/*
		SL->Ecnt = DECAY_TO_ATTACK[ENV_TAB[SL->Ecnt >> ENV_LBITS]] + ENV_ATTACK;
		SL->Ecnt = 0;
		*/

		SL->Einc = SL->EincA;
		SL->Ecmp = ENV_DECAY;
		SL->Ecurp = ATTACK;
	}
}